

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::write_wallet_settings_concurrently::test_method
          (write_wallet_settings_concurrently *this)

{
  long lVar1;
  Chain *pCVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer pCVar5;
  size_type sVar6;
  pointer ptVar7;
  thread *ptVar8;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar9;
  thread *t;
  pointer ptVar10;
  VType VVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  long *plVar14;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  allocator<std::thread> *paVar15;
  check_type cVar16;
  thread local_160;
  char *local_158;
  char *local_150;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  assertion_result local_120;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  pointer chain;
  long local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined4 local_b4;
  undefined **local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  char *local_98;
  SettingsValue wallets;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x155;
  file.m_begin = (iterator)&local_f8;
  chain = pCVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"wallet",(allocator<char> *)&local_d8);
  _cVar16 = 0x668b24;
  (*pCVar2->_vptr_Chain[0x30])(&wallets,pCVar2,&local_b0);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(wallets.typ == VNULL);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8 = "chain->getRwSetting(\"wallet\").isNull()";
  local_c0 = "";
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_150 = "";
  paVar15 = (allocator<std::thread> *)0x0;
  pvVar12 = (iterator)0x2;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)&threads,2,0,WARN,_cVar16,(size_t)&local_158,0x155);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  UniValue::~UniValue(&wallets);
  std::__cxx11::string::~string((string *)&local_b0);
  local_160._M_id._M_thread = (id)&chain;
  local_b4 = 5;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  for (VVar11 = VNULL;
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish, VVar11 != VBOOL; VVar11 = VVar11 + VOBJ) {
    wallets.typ = VVar11;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                         ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,sVar6)
      ;
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__1_const&,int&>
                ((allocator_type *)(((long)ptVar3 - (long)ptVar10) + (long)ptVar7),&local_160,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,(int *)paVar15);
      ptVar8 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar10,ptVar3,ptVar7,(allocator<std::thread> *)&threads);
      paVar15 = (allocator<std::thread> *)&threads;
      ptVar8 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar3,ptVar4,ptVar8 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar10,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar10 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar7;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar8;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__1_const&,int&>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_160,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,(int *)paVar15);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  wallets.typ = VBOOL;
  for (ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; pCVar5 = chain, ptVar10 != ptVar3;
      ptVar10 = ptVar10 + 1) {
    std::thread::join();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"wallet",(allocator<char> *)&local_120);
  (*pCVar5->_vptr_Chain[0x30])(&wallets,pCVar5,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_120.m_message.px = (element_type *)0xc834e8;
  local_c8 = "";
  local_c0 = "";
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  file_00.m_end = (iterator)0x15e;
  file_00.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,msg_00
            );
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_01139f30;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_d0 = "";
  pvVar9 = UniValue::getValues(&wallets);
  local_e0 = ((long)(pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0x58;
  plVar14 = &local_e0;
  paVar15 = (allocator<std::thread> *)&DAT_00000001;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_b0,&local_d8,0x15e);
  UniValue::~UniValue(&wallets);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  local_160._M_id._M_thread = (id)&chain;
  local_b4 = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  for (VVar11 = VNULL;
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish, VVar11 != VBOOL; VVar11 = VVar11 + VOBJ) {
    wallets.typ = VVar11;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                         ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,sVar6)
      ;
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__2_const&,int&>
                ((allocator_type *)(((long)ptVar3 - (long)ptVar10) + (long)ptVar7),&local_160,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,(int *)paVar15);
      ptVar8 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar10,ptVar3,ptVar7,(allocator<std::thread> *)&threads);
      paVar15 = (allocator<std::thread> *)&threads;
      ptVar8 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar3,ptVar4,ptVar8 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar10,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar10 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar7;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar8;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__2_const&,int&>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_160,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,(int *)paVar15);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  wallets.typ = VBOOL;
  for (ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; pCVar5 = chain, ptVar10 != ptVar3;
      ptVar10 = ptVar10 + 1) {
    std::thread::join();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"wallet",(allocator<char> *)&local_120);
  (*pCVar5->_vptr_Chain[0x30])(&wallets,pCVar5,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_120.m_message.px = (element_type *)0xc834e8;
  local_c8 = "";
  local_c0 = "";
  msg_01.m_end = (iterator)plVar14;
  msg_01.m_begin = pvVar12;
  file_01.m_end = (iterator)0x15e;
  file_01.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c8,msg_01
            );
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_01139f30;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_d0 = "";
  pvVar9 = UniValue::getValues(&wallets);
  local_e0 = ((long)(pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0x58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_b0,&local_d8,0x15e,1,2,&local_e0,"wallets.getValues().size()",&local_b4,
             "num_expected_wallets");
  UniValue::~UniValue(&wallets);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(write_wallet_settings_concurrently, TestingSetup)
{
    auto chain = m_node.chain.get();
    const auto NUM_WALLETS{5};

    // Since we're counting the number of wallets, ensure we start without any.
    BOOST_REQUIRE(chain->getRwSetting("wallet").isNull());

    const auto& check_concurrent_wallet = [&](const auto& settings_function, int num_expected_wallets) {
        std::vector<std::thread> threads;
        threads.reserve(NUM_WALLETS);
        for (auto i{0}; i < NUM_WALLETS; ++i) threads.emplace_back(settings_function, i);
        for (auto& t : threads) t.join();

        auto wallets = chain->getRwSetting("wallet");
        BOOST_CHECK_EQUAL(wallets.getValues().size(), num_expected_wallets);
    };

    // Add NUM_WALLETS wallets concurrently, ensure we end up with NUM_WALLETS stored.
    check_concurrent_wallet([&chain](int i) {
        Assert(AddWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/NUM_WALLETS);

    // Remove NUM_WALLETS wallets concurrently, ensure we end up with 0 wallets.
    check_concurrent_wallet([&chain](int i) {
        Assert(RemoveWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/0);
}